

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::anon_unknown_3::PLYValueList::~PLYValueList(PLYValueList *this)

{
  pointer ppPVar1;
  size_type sVar2;
  reference ppPVar3;
  vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_> *in_RDI;
  size_t i;
  ulong local_10;
  
  (in_RDI->super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__PLYValueList_0016a648;
  ppPVar1 = (in_RDI->super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (ppPVar1 != (pointer)0x0) {
    (*(code *)(*ppPVar1)[1]._vptr_PLYValue)();
  }
  local_10 = 0;
  while( true ) {
    sVar2 = std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::size
                      ((vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_> *)
                       &in_RDI[1].
                        super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= local_10) break;
    ppPVar3 = std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::operator[]
                        ((vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_> *)
                         &in_RDI[1].
                          super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,local_10);
    if (*ppPVar3 != (value_type)0x0) {
      (*(*ppPVar3)->_vptr_PLYValue[1])();
    }
    local_10 = local_10 + 1;
  }
  std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::~vector(in_RDI);
  PLYValue::~PLYValue((PLYValue *)in_RDI);
  return;
}

Assistant:

~PLYValueList()
    {
      delete size;

      for (size_t i=0; i<list.size(); i++)
      {
        delete list[i];
      }
    }